

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void hash_gen_request(cf_hash_drbg_sha256 *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  uint32_t uVar1;
  uint8_t local_68 [8];
  uint8_t data [55];
  size_t nout_local;
  void *out_local;
  size_t naddnl_local;
  void *addnl_local;
  cf_hash_drbg_sha256 *ctx_local;
  
  unique0x100000b3 = nout;
  uVar1 = cf_hash_drbg_sha256_needs_reseed(ctx);
  if (uVar1 != 0) {
    abort();
  }
  hash_process_addnl(&cf_sha256,addnl,naddnl,ctx->V,0x37);
  memcpy(local_68,ctx,0x37);
  hash_generate(&cf_sha256,local_68,0x37,out,stack0xffffffffffffffd0);
  hash_step(&cf_sha256,ctx->V,0x37,ctx->C,0x37,&ctx->reseed_counter);
  return;
}

Assistant:

static void hash_gen_request(cf_hash_drbg_sha256 *ctx,
                             const void *addnl, size_t naddnl,
                             void *out, size_t nout)
{
  uint8_t data[440/8]; /* a temporary copy of V, which gets incremented by generate */

  assert(!cf_hash_drbg_sha256_needs_reseed(ctx));

  hash_process_addnl(&cf_sha256, addnl, naddnl, ctx->V, sizeof ctx->V);
  assert(sizeof data == sizeof ctx->V);
  memcpy(data, ctx->V, sizeof ctx->V);
  hash_generate(&cf_sha256, data, sizeof data, out, nout);
  hash_step(&cf_sha256, ctx->V, sizeof ctx->V, ctx->C, sizeof ctx->C, &ctx->reseed_counter);
}